

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O2

s32 __thiscall irr::gui::CGUIListBox::getItemAt(CGUIListBox *this,s32 xpos,s32 ypos)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = -1;
  if ((((*(int *)&this->field_0x40 <= xpos) && (xpos < *(int *)&this->field_0x48)) &&
      (uVar1 = *(uint *)&this->field_0x44, (int)uVar1 <= ypos)) &&
     ((ypos < *(int *)&this->field_0x4c && (this->ItemHeight != 0)))) {
    iVar2 = (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2c])
                      ();
    iVar2 = (int)(iVar2 + ~uVar1 + ypos) / this->ItemHeight;
    if (-1 < iVar2) {
      iVar3 = -1;
      if (iVar2 < (int)(((long)(this->Items).m_data.
                               super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->Items).m_data.
                              super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x48)) {
        iVar3 = iVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

s32 CGUIListBox::getItemAt(s32 xpos, s32 ypos) const
{
	if (xpos < AbsoluteRect.UpperLeftCorner.X || xpos >= AbsoluteRect.LowerRightCorner.X || ypos < AbsoluteRect.UpperLeftCorner.Y || ypos >= AbsoluteRect.LowerRightCorner.Y)
		return -1;

	if (ItemHeight == 0)
		return -1;

	s32 item = ((ypos - AbsoluteRect.UpperLeftCorner.Y - 1) + ScrollBar->getPos()) / ItemHeight;
	if (item < 0 || item >= (s32)Items.size())
		return -1;

	return item;
}